

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

OPJ_BOOL opj_event_msg(opj_event_mgr_t *p_event_mgr,OPJ_INT32 event_type,char *fmt,...)

{
  opj_msg_callback p_Var1;
  void *pvVar2;
  char in_AL;
  opj_msg_callback *pp_Var3;
  undefined8 in_RCX;
  OPJ_BOOL OVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arg;
  char message [512];
  undefined8 local_2f8;
  void **local_2f0;
  undefined1 *local_2e8;
  undefined1 local_2d8 [24];
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined8 local_298;
  undefined8 local_288;
  undefined8 local_278;
  undefined8 local_268;
  undefined8 local_258;
  undefined8 local_248;
  undefined8 local_238;
  char local_228 [511];
  undefined1 local_29;
  
  if (in_AL != '\0') {
    local_2a8 = in_XMM0_Qa;
    local_298 = in_XMM1_Qa;
    local_288 = in_XMM2_Qa;
    local_278 = in_XMM3_Qa;
    local_268 = in_XMM4_Qa;
    local_258 = in_XMM5_Qa;
    local_248 = in_XMM6_Qa;
    local_238 = in_XMM7_Qa;
  }
  OVar4 = 0;
  if (p_event_mgr != (opj_event_mgr_t *)0x0) {
    if (event_type == 4) {
      pp_Var3 = &p_event_mgr->info_handler;
      p_event_mgr = (opj_event_mgr_t *)&p_event_mgr->m_info_data;
    }
    else if (event_type == 2) {
      pp_Var3 = &p_event_mgr->warning_handler;
      p_event_mgr = (opj_event_mgr_t *)&p_event_mgr->m_warning_data;
    }
    else {
      if (event_type != 1) {
        return 0;
      }
      pp_Var3 = &p_event_mgr->error_handler;
    }
    p_Var1 = *pp_Var3;
    OVar4 = 0;
    if ((p_Var1 != (opj_msg_callback)0x0) && (OVar4 = 1, fmt != (char *)0x0)) {
      pvVar2 = p_event_mgr->m_error_data;
      local_2c0 = in_RCX;
      local_2b8 = in_R8;
      local_2b0 = in_R9;
      memset(local_228,0,0x200);
      local_2f8 = 0x3000000018;
      local_2f0 = &arg[0].overflow_arg_area;
      local_2e8 = local_2d8;
      vsnprintf(local_228,0x200,fmt,&local_2f8);
      local_29 = 0;
      (*p_Var1)(local_228,pvVar2);
    }
  }
  return OVar4;
}

Assistant:

OPJ_BOOL opj_event_msg(opj_event_mgr_t* p_event_mgr, OPJ_INT32 event_type,
                       const char *fmt, ...)
{
#define OPJ_MSG_SIZE 512 /* 512 bytes should be more than enough for a short message */
    opj_msg_callback msg_handler = 00;
    void * l_data = 00;

    if (p_event_mgr != 00) {
        switch (event_type) {
        case EVT_ERROR:
            msg_handler = p_event_mgr->error_handler;
            l_data = p_event_mgr->m_error_data;
            break;
        case EVT_WARNING:
            msg_handler = p_event_mgr->warning_handler;
            l_data = p_event_mgr->m_warning_data;
            break;
        case EVT_INFO:
            msg_handler = p_event_mgr->info_handler;
            l_data = p_event_mgr->m_info_data;
            break;
        default:
            break;
        }
        if (msg_handler == 00) {
            return OPJ_FALSE;
        }
    } else {
        return OPJ_FALSE;
    }

    if ((fmt != 00) && (p_event_mgr != 00)) {
        va_list arg;
        char message[OPJ_MSG_SIZE];
        memset(message, 0, OPJ_MSG_SIZE);
        /* initialize the optional parameter list */
        va_start(arg, fmt);
        /* parse the format string and put the result in 'message' */
        vsnprintf(message, OPJ_MSG_SIZE, fmt, arg);
        /* force zero termination for Windows _vsnprintf() of old MSVC */
        message[OPJ_MSG_SIZE - 1] = '\0';
        /* deinitialize the optional parameter list */
        va_end(arg);

        /* output the message to the user program */
        msg_handler(message, l_data);
    }

    return OPJ_TRUE;
}